

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuildingCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  int iVar1;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text_00._M_str =
       "if ($get_has_field_bit_from_local$) {\n  result.$name$_ = $name$Builder_ == null\n      ? $name$_\n      : $name$Builder_.build();\n"
  ;
  text_00._M_len = 0x80;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_00);
  iVar1 = (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[5])
                    (this);
  if (0 < iVar1) {
    text_01._M_str = "  $set_has_field_bit_to_local$;\n";
    text_01._M_len = 0x20;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text_01);
  }
  text._M_str = "}\n";
  text._M_len = 2;
  io::Printer::Print<>(printer,text);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "if ($get_has_field_bit_from_local$) {\n"
                 "  result.$name$_ = $name$Builder_ == null\n"
                 "      ? $name$_\n"
                 "      : $name$Builder_.build();\n");
  if (GetNumBitsForMessage() > 0) {
    printer->Print(variables_, "  $set_has_field_bit_to_local$;\n");
  }
  printer->Print("}\n");
}